

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

sub_idx_t __thiscall
lf::base::RefEl::SubSubEntity2SubEntity
          (RefEl *this,dim_t sub_codim,sub_idx_t sub_index,dim_t sub_rel_codim,
          sub_idx_t sub_rel_index)

{
  sub_idx_t sVar1;
  dim_t dVar2;
  size_type sVar3;
  dim_t dVar4;
  runtime_error *prVar5;
  const_reference this_00;
  const_reference this_01;
  const_reference pvVar6;
  RefEl local_35 [13];
  sub_idx_t local_28;
  dim_t local_24;
  sub_idx_t sub_rel_index_local;
  dim_t sub_rel_codim_local;
  sub_idx_t sub_index_local;
  dim_t sub_codim_local;
  RefEl *this_local;
  
  local_28 = sub_rel_index;
  local_24 = sub_rel_codim;
  sub_rel_index_local = sub_index;
  sub_rel_codim_local = sub_codim;
  _sub_index_local = this;
  dVar2 = Dimension(this);
  sVar1 = sub_rel_index_local;
  if (dVar2 < sub_codim) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"sub_codim > Dimension");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = NumSubEntities(this,sub_rel_codim_local);
  dVar2 = local_24;
  if (sVar3 < sVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"sub_index >= NumSubEntities");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar4 = Dimension(this);
  sVar1 = local_28;
  if (dVar4 - sub_rel_codim_local < dVar2) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"subSubCodim out of bounds.");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_35[0] = SubType(this,sub_rel_codim_local,sub_rel_index_local);
  sVar3 = NumSubEntities(local_35,local_24);
  dVar2 = sub_rel_codim_local;
  if (sVar3 <= sVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"sub_sub_index out of bounds.");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->type_ == kPoint) {
    this_local._4_4_ = 0;
  }
  else if (sub_rel_codim_local == 0) {
    this_local._4_4_ = local_28;
  }
  else {
    dVar4 = Dimension(this);
    if (dVar2 == dVar4) {
      this_local._4_4_ = sub_rel_index_local;
    }
    else if (this->type_ == kTria) {
      this_00 = std::array<std::array<unsigned_int,_2UL>,_3UL>::operator[]
                          (&sub_sub_entity_index_tria_,(ulong)sub_rel_index_local);
      pvVar6 = std::array<unsigned_int,_2UL>::operator[](this_00,(ulong)local_28);
      this_local._4_4_ = *pvVar6;
    }
    else {
      if (this->type_ != kQuad) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"This code should never be reached.");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      this_01 = std::array<std::array<unsigned_int,_2UL>,_4UL>::operator[]
                          (&sub_sub_entity_index_quad_,(ulong)sub_rel_index_local);
      pvVar6 = std::array<unsigned_int,_2UL>::operator[](this_01,(ulong)local_28);
      this_local._4_4_ = *pvVar6;
    }
  }
  return this_local._4_4_;
}

Assistant:

[[nodiscard]] constexpr sub_idx_t SubSubEntity2SubEntity(
      dim_t sub_codim, sub_idx_t sub_index, dim_t sub_rel_codim,
      sub_idx_t sub_rel_index) const {
    LF_ASSERT_MSG_CONSTEXPR(sub_codim >= 0, "sub_codim negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_codim <= Dimension(), "sub_codim > Dimension");
    LF_ASSERT_MSG_CONSTEXPR(sub_index >= 0, "sub_index negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_index <= NumSubEntities(sub_codim),
                            "sub_index >= NumSubEntities");
    LF_ASSERT_MSG_CONSTEXPR(sub_rel_codim >= 0, "sub_rel_codim negative.");
    LF_ASSERT_MSG_CONSTEXPR(sub_rel_codim <= Dimension() - sub_codim,
                            "subSubCodim out of bounds.");
    LF_ASSERT_MSG_CONSTEXPR(sub_rel_index >= 0, "sub_rel_index negative.");
    LF_ASSERT_MSG_CONSTEXPR(
        sub_rel_index <
            SubType(sub_codim, sub_index).NumSubEntities(sub_rel_codim),
        "sub_sub_index out of bounds.");

    if (type_ == RefElType::kPoint) {
      return 0;
    }
    if (sub_codim == 0) {
      return sub_rel_index;
    }
    if (sub_codim == Dimension()) {
      return sub_index;
    }

    // from here on, it must be a segment
    switch (type_) {
      case RefElType::kTria:
        return sub_sub_entity_index_tria_[sub_index][sub_rel_index];
      case RefElType::kQuad:
        return sub_sub_entity_index_quad_[sub_index][sub_rel_index];
      default:
        LF_ASSERT_MSG_CONSTEXPR(false, "This code should never be reached.");
    }

    return 0;  // Prevent warnings from compiler...
  }